

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

BinaryExpr<const_type_safe::flag_&,_bool> * __thiscall
Catch::ExprLhs<const_type_safe::flag_&>::operator==
          (BinaryExpr<const_type_safe::flag_&,_bool> *__return_storage_ptr__,
          ExprLhs<const_type_safe::flag_&> *this,bool rhs)

{
  bool bVar1;
  flag *pfVar2;
  StringRef local_38;
  
  pfVar2 = this->m_lhs;
  bVar1 = pfVar2->state_;
  StringRef::StringRef(&local_38,"==");
  (__return_storage_ptr__->super_ITransientExpression).m_isBinaryExpression = true;
  (__return_storage_ptr__->super_ITransientExpression).m_result = (bool)(~(bVar1 ^ rhs) & 1);
  (__return_storage_ptr__->super_ITransientExpression)._vptr_ITransientExpression =
       (_func_int **)&PTR_streamReconstructedExpression_0021da50;
  __return_storage_ptr__->m_lhs = pfVar2;
  (__return_storage_ptr__->m_op).m_start = local_38.m_start;
  (__return_storage_ptr__->m_op).m_size = local_38.m_size;
  __return_storage_ptr__->m_rhs = rhs;
  return __return_storage_ptr__;
}

Assistant:

auto operator == ( bool rhs ) -> BinaryExpr<LhsT, bool> const {
            return { m_lhs == rhs, m_lhs, "==", rhs };
        }